

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O0

longlong __thiscall mkvparser::Chapters::Atom::GetStopTime(Atom *this,Chapters *pChapters)

{
  longlong lVar1;
  longlong unaff_retaddr;
  
  lVar1 = GetTime(pChapters,unaff_retaddr);
  return lVar1;
}

Assistant:

long long Chapters::Atom::GetStopTime(const Chapters* pChapters) const {
  return GetTime(pChapters, m_stop_timecode);
}